

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O3

void __thiscall Matrix3f::setRow(Matrix3f *this,int i,Vector3f *v)

{
  long lVar1;
  float fVar2;
  
  fVar2 = Vector3f::x(v);
  lVar1 = (long)i;
  this->m_elements[lVar1] = fVar2;
  fVar2 = Vector3f::y(v);
  this->m_elements[lVar1 + 3] = fVar2;
  fVar2 = Vector3f::z(v);
  this->m_elements[lVar1 + 6] = fVar2;
  return;
}

Assistant:

void Matrix3f::setRow( int i, const Vector3f& v )
{
	m_elements[ i ] = v.x();
	m_elements[ i + 3 ] = v.y();
	m_elements[ i + 6 ] = v.z();
}